

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.cpp
# Opt level: O1

void recursedeletenode(btDbvt *pdbvt,btDbvtNode *node)

{
  if ((node->field_2).childs[1] != (btDbvtNode *)0x0) {
    recursedeletenode(pdbvt,(node->field_2).childs[0]);
    recursedeletenode(pdbvt,(node->field_2).childs[1]);
  }
  if (pdbvt->m_root == node) {
    pdbvt->m_root = (btDbvtNode *)0x0;
  }
  btAlignedFreeInternal(pdbvt->m_free);
  pdbvt->m_free = node;
  return;
}

Assistant:

static void						recursedeletenode(	btDbvt* pdbvt,
												  btDbvtNode* node)
{
	if(!node->isleaf())
	{
		recursedeletenode(pdbvt,node->childs[0]);
		recursedeletenode(pdbvt,node->childs[1]);
	}
	if(node==pdbvt->m_root) pdbvt->m_root=0;
	deletenode(pdbvt,node);
}